

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

ArrayLen * __thiscall MixedArena::alloc<wasm::ArrayLen>(MixedArena *this)

{
  ArrayLen *pAVar1;
  
  pAVar1 = (ArrayLen *)allocSpace(this,0x18,8);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)76>).super_Expression._id = ArrayLenId;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)76>).super_Expression.type.id = 0;
  return pAVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }